

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

FuncVec * __thiscall dg::llvmdg::LazyLLVMCallGraph::callees(LazyLLVMCallGraph *this,Function *F)

{
  bool bVar1;
  reference ppFVar2;
  Function *in_RDX;
  LazyLLVMCallGraph *in_RSI;
  LazyLLVMCallGraph *in_RDI;
  FuncNode *nd;
  const_iterator __end2;
  const_iterator __begin2;
  vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
  *__range2;
  FuncNode *fnd;
  FuncVec *ret;
  Function *in_stack_ffffffffffffff98;
  LazyLLVMCallGraph *__x;
  GenericCallGraph<const_llvm::Function_*> *in_stack_ffffffffffffffb8;
  __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
  local_38;
  vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
  *local_30;
  FuncNode *local_28;
  undefined1 local_19;
  LazyLLVMCallGraph *this_00;
  
  local_19 = 0;
  __x = in_RDI;
  this_00 = in_RSI;
  std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::vector
            ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)0x1cd4a4);
  bVar1 = hasFn(in_RDI,in_stack_ffffffffffffff98);
  if (!bVar1) {
    _populateCalledFunctions(this_00,in_RDX);
  }
  local_28 = GenericCallGraph<const_llvm::Function_*>::get
                       (in_stack_ffffffffffffffb8,(Function **)in_RSI);
  local_30 = GenericCallGraph<const_llvm::Function_*>::FuncNode::getCalls(local_28);
  local_38._M_current =
       (FuncNode **)
       std::
       vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
       ::begin((vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                *)in_stack_ffffffffffffff98);
  std::
  vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
  ::end((vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
         *)in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    ppFVar2 = __gnu_cxx::
              __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
              ::operator*(&local_38);
    GenericCallGraph<const_llvm::Function_*>::FuncNode::getValue(*ppFVar2);
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
              ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)in_RSI,
               (value_type *)__x);
    __gnu_cxx::
    __normal_iterator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*const_*,_std::vector<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>_>
    ::operator++(&local_38);
  }
  return (FuncVec *)__x;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        if (!hasFn(F)) {
            _populateCalledFunctions(F);
        }
        auto fnd = _cg.get(F);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }